

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryControllersLoader15.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryControllersLoader15::begin__skin
          (LibraryControllersLoader15 *this,skin__AttributeData *attributeData)

{
  byte bVar1;
  uint *in_RSI;
  long in_RDI;
  skin__AttributeData attrData;
  URI *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  uint local_100 [60];
  uint *local_10;
  
  local_10 = in_RSI;
  skin__AttributeData::skin__AttributeData((skin__AttributeData *)0xc2e46e);
  local_100[0] = 0;
  if ((*local_10 & 1) == 1) {
    COLLADABU::URI::operator=
              ((URI *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8);
    local_100[0] = local_100[0] | 1;
  }
  bVar1 = (**(code **)(**(long **)(in_RDI + 0x20) + 0xd8))(*(long **)(in_RDI + 0x20),local_100);
  skin__AttributeData::~skin__AttributeData((skin__AttributeData *)0xc2e4f1);
  return (bool)(bVar1 & 1);
}

Assistant:

bool LibraryControllersLoader15::begin__skin( const COLLADASaxFWL15::skin__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__skin(attributeData));
COLLADASaxFWL::skin__AttributeData attrData;
attrData.present_attributes = 0;
if ( (attributeData.present_attributes & COLLADASaxFWL15::skin__AttributeData::ATTRIBUTE_SOURCE_PRESENT) == COLLADASaxFWL15::skin__AttributeData::ATTRIBUTE_SOURCE_PRESENT ) {
    attrData.source = attributeData.source;
    attrData.present_attributes |= COLLADASaxFWL::skin__AttributeData::ATTRIBUTE_SOURCE_PRESENT;
}
return mLoader->begin__skin(attrData);
}